

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_vars.cc
# Opt level: O3

void tcmalloc::Static::InitStaticVars(void)

{
  byte bVar1;
  Span *pSVar2;
  StackTrace *pSVar3;
  byte *pbVar4;
  CentralFreeList *this;
  size_t cl;
  
  SizeMap::Init((SizeMap *)&sizemap_);
  span_allocator_._16_4_ = 0;
  span_allocator_._20_4_ = 0;
  span_allocator_._24_4_ = 0;
  span_allocator_._0_8_ = 0;
  span_allocator_._8_4_ = 0;
  span_allocator_._12_4_ = 0;
  pSVar2 = PageHeapAllocator<tcmalloc::Span>::New
                     ((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  pSVar2->start = CONCAT44(span_allocator_._20_4_,span_allocator_._16_4_);
  span_allocator_._16_4_ = SUB84(pSVar2,0);
  span_allocator_._20_4_ = (undefined4)((ulong)pSVar2 >> 0x20);
  span_allocator_._24_4_ = span_allocator_._24_4_ + -1;
  PageHeapAllocator<tcmalloc::Span>::New((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  PageHeapAllocator<tcmalloc::Span>::New((PageHeapAllocator<tcmalloc::Span> *)span_allocator_);
  stacktrace_allocator_._0_8_ = 0;
  stacktrace_allocator_._8_4_ = 0;
  stacktrace_allocator_._12_4_ = 0;
  stacktrace_allocator_._16_4_ = 0;
  stacktrace_allocator_._20_4_ = 0;
  stacktrace_allocator_._24_4_ = 0;
  pSVar3 = PageHeapAllocator<tcmalloc::StackTrace>::New
                     ((PageHeapAllocator<tcmalloc::StackTrace> *)stacktrace_allocator_);
  pSVar3->size = CONCAT44(stacktrace_allocator_._20_4_,stacktrace_allocator_._16_4_);
  stacktrace_allocator_._16_4_ = SUB84(pSVar3,0);
  stacktrace_allocator_._20_4_ = (undefined4)((ulong)pSVar3 >> 0x20);
  stacktrace_allocator_._24_4_ = stacktrace_allocator_._24_4_ + -1;
  if (DAT_0013c290 != 0) {
    this = (CentralFreeList *)&central_cache_;
    cl = 0;
    do {
      CentralFreeList::Init(this,cl);
      cl = cl + 1;
      this = this + 1;
    } while (cl < DAT_0013c290);
  }
  PageHeap::PageHeap((PageHeap *)pageheap_,DAT_0013c288);
  pbVar4 = (byte *)TCMallocGetenvSafe("TCMALLOC_AGGRESSIVE_DECOMMIT");
  if (pbVar4 != (byte *)0x0) {
    bVar1 = *pbVar4;
    pageheap_[0x1830dc] = 1;
    if ((((bVar1 - 0x54 < 0x26) && ((0x2100000021U >> ((ulong)(bVar1 - 0x54) & 0x3f) & 1) != 0)) ||
        (bVar1 == 0)) || (bVar1 == 0x31)) goto LAB_0011e55d;
  }
  pageheap_[0x1830dc] = 0;
LAB_0011e55d:
  inited_ = 1;
  DLL_Init((Span *)sampled_objects_);
  return;
}

Assistant:

void Static::InitStaticVars() {
  sizemap_.Init();
  span_allocator_.Init();
  span_allocator_.New(); // Reduce cache conflicts
  span_allocator_.New(); // Reduce cache conflicts
  stacktrace_allocator_.Init();

  for (int i = 0; i < num_size_classes(); ++i) {
    central_cache_[i].Init(i);
  }

  new (pageheap()) PageHeap(sizemap_.min_span_size_in_pages());

#if defined(ENABLE_AGGRESSIVE_DECOMMIT_BY_DEFAULT)
  const bool kDefaultAggressiveDecommit = true;
#else
  const bool kDefaultAggressiveDecommit = false;
#endif


  bool aggressive_decommit =
    tcmalloc::commandlineflags::StringToBool(
      TCMallocGetenvSafe("TCMALLOC_AGGRESSIVE_DECOMMIT"),
                         kDefaultAggressiveDecommit);

  pageheap()->SetAggressiveDecommit(aggressive_decommit);

  inited_ = true;

  DLL_Init(&sampled_objects_);
}